

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::BitXorOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  ulong uVar2;
  FunctionData *pFVar3;
  unsigned_long *puVar4;
  element_type *peVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  AggregateUnaryInput input_data;
  uhugeint_t local_90;
  Vector *local_80;
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar1 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar6 = 0;
      uVar10 = 0;
      local_80 = input;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar7 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar7 = count;
          }
LAB_004ad0ad:
          uVar8 = uVar10;
          if (uVar10 < uVar7) {
            puVar11 = (undefined8 *)(uVar10 * 0x10 + lVar1 + 8);
            do {
              local_78.input = (AggregateInputData *)puVar11[-1];
              local_78.input_mask = (ValidityMask *)*puVar11;
              if (*state == '\0') {
                *(AggregateInputData **)(state + 8) = local_78.input;
                *(ValidityMask **)(state + 0x10) = local_78.input_mask;
                *state = '\x01';
              }
              else {
                duckdb::uhugeint_t::operator^=((uhugeint_t *)(state + 8),(uhugeint_t *)&local_78);
              }
              uVar10 = uVar10 + 1;
              puVar11 = puVar11 + 2;
              uVar8 = uVar7;
            } while (uVar7 != uVar10);
          }
        }
        else {
          uVar2 = *(ulong *)(*(long *)(input + 0x28) + uVar6 * 8);
          uVar7 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar7 = count;
          }
          if (uVar2 == 0xffffffffffffffff) goto LAB_004ad0ad;
          uVar8 = uVar7;
          if ((uVar2 != 0) && (uVar8 = uVar10, uVar10 < uVar7)) {
            puVar11 = (undefined8 *)(uVar10 * 0x10 + lVar1 + 8);
            uVar9 = 0;
            do {
              if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
                local_78.input = (AggregateInputData *)puVar11[-1];
                local_78.input_mask = (ValidityMask *)*puVar11;
                if (*state == '\0') {
                  *(AggregateInputData **)(state + 8) = local_78.input;
                  *(ValidityMask **)(state + 0x10) = local_78.input_mask;
                  *state = '\x01';
                }
                else {
                  duckdb::uhugeint_t::operator^=((uhugeint_t *)(state + 8),(uhugeint_t *)&local_78);
                }
              }
              uVar9 = uVar9 + 1;
              puVar11 = puVar11 + 2;
              uVar8 = uVar7;
              input = local_80;
            } while (uVar7 - uVar10 != uVar9);
          }
        }
        uVar6 = uVar6 + 1;
        uVar10 = uVar8;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      BitXorOperation::
      ConstantOperation<duckdb::uhugeint_t,duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitXorOperation>
                ((BitState<duckdb::uhugeint_t> *)state,*(uhugeint_t **)(input + 0x20),&local_78,
                 count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_78.input_idx == 0) {
      if (count != 0) {
        pFVar3 = ((local_78.input)->bind_data).ptr;
        uVar10 = 0;
        do {
          uVar6 = uVar10;
          if (pFVar3 != (FunctionData *)0x0) {
            uVar6 = (ulong)*(uint *)(pFVar3 + uVar10 * 4);
          }
          puVar4 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[uVar6 * 2];
          peVar5 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_data)[uVar6].internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if (*state == '\0') {
            *(unsigned_long **)(state + 8) = puVar4;
            *(element_type **)(state + 0x10) = peVar5;
            *state = '\x01';
          }
          else {
            local_90.lower = (uint64_t)puVar4;
            local_90.upper = (uint64_t)peVar5;
            duckdb::uhugeint_t::operator^=((uhugeint_t *)(state + 8),&local_90);
          }
          uVar10 = uVar10 + 1;
        } while (count != uVar10);
      }
    }
    else if (count != 0) {
      pFVar3 = ((local_78.input)->bind_data).ptr;
      uVar10 = 0;
      do {
        uVar6 = uVar10;
        if (pFVar3 != (FunctionData *)0x0) {
          uVar6 = (ulong)*(uint *)(pFVar3 + uVar10 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0)) {
          puVar4 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[uVar6 * 2];
          peVar5 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_data)[uVar6].internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if (*state == '\0') {
            *(unsigned_long **)(state + 8) = puVar4;
            *(element_type **)(state + 0x10) = peVar5;
            *state = '\x01';
          }
          else {
            local_90.lower = (uint64_t)puVar4;
            local_90.upper = (uint64_t)peVar5;
            duckdb::uhugeint_t::operator^=((uhugeint_t *)(state + 8),&local_90);
          }
        }
        uVar10 = uVar10 + 1;
      } while (count != uVar10);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}